

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmPMove<(moira::Instr)184,(moira::Mode)10,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 *puVar1;
  bool bVar2;
  StrWriter *pSVar3;
  Ea<(moira::Mode)10,_4> local_c4;
  Ea<(moira::Mode)10,_2> local_ac;
  Int local_94;
  int local_90;
  Int local_88 [2];
  Ea<(moira::Mode)10,_4> local_80;
  Ea<(moira::Mode)10,_2> local_68;
  int local_54;
  int local_4c;
  char *pcStack_48;
  Size s;
  char *r;
  char *suffix;
  char *prefix;
  u8 nr;
  u8 preg;
  u8 fmt;
  u8 reg;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  _nr = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  prefix._4_4_ = dasmIncRead<2>(this,addr);
  prefix._3_1_ = (byte)ext._2_2_ & 7;
  prefix._2_1_ = (byte)(prefix._4_4_ >> 0xd) & 7;
  prefix._1_1_ = (byte)(prefix._4_4_ >> 10) & 7;
  prefix._0_1_ = (byte)(prefix._4_4_ >> 2) & 7;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar2 = isValidExtMMU(this,PMOVE,IXPC,ext._2_2_,prefix._4_4_), bVar2)) {
    bVar2 = true;
    if (**(int **)(addr_local + 0xc) != 3) {
      bVar2 = **(int **)(addr_local + 0xc) == 1;
    }
    suffix = "";
    if (bVar2) {
      suffix = "%";
    }
    r = "";
    if ((prefix._4_4_ & 0x100) != 0) {
      r = "fd";
    }
    pcStack_48 = "";
    local_4c = 0;
    if (prefix._2_1_ == 0) {
      if (prefix._1_1_ == 2) {
        pcStack_48 = "tt0";
        local_4c = 4;
      }
      else if (prefix._1_1_ == 3) {
        pcStack_48 = "tt1";
        local_4c = 4;
      }
    }
    else if (prefix._2_1_ == 2) {
      switch(prefix._1_1_) {
      case 0:
        pcStack_48 = "tc";
        local_4c = 4;
        break;
      case 1:
        pcStack_48 = "drp";
        local_4c = 4;
        break;
      case 2:
        pcStack_48 = "srp";
        local_4c = 4;
        break;
      case 3:
        pcStack_48 = "crp";
        local_4c = 4;
        break;
      case 4:
        pcStack_48 = "cal";
        local_4c = 4;
        break;
      case 5:
        pcStack_48 = "val";
        local_4c = 4;
        break;
      case 6:
        pcStack_48 = "scc";
        local_4c = 4;
        break;
      case 7:
        pcStack_48 = "ac";
        local_4c = 4;
      }
    }
    else if (prefix._2_1_ == 3) {
      switch(prefix._1_1_) {
      case 0:
        pcStack_48 = "psr";
        local_4c = 2;
        break;
      case 1:
        pcStack_48 = "pcsr";
        local_4c = 2;
        break;
      case 4:
        pcStack_48 = "bad";
        local_4c = 2;
        break;
      case 5:
        pcStack_48 = "bac";
        local_4c = 2;
      }
    }
    if ((prefix._4_4_ & 0x200) == 0) {
      pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
      pSVar3 = StrWriter::operator<<(pSVar3,r);
      local_54 = addr_local[0xe];
      StrWriter::operator<<(pSVar3,(Tab)local_54);
      puVar1 = addr_local;
      if (local_4c == 2) {
        Op<(moira::Mode)10,2>(&local_68,this,(ushort)prefix._3_1_,_old);
        pSVar3 = StrWriter::operator<<((StrWriter *)puVar1,&local_68);
        StrWriter::operator<<(pSVar3);
      }
      puVar1 = addr_local;
      if (local_4c == 4) {
        Op<(moira::Mode)10,4>(&local_80,this,(ushort)prefix._3_1_,_old);
        pSVar3 = StrWriter::operator<<((StrWriter *)puVar1,&local_80);
        StrWriter::operator<<(pSVar3);
      }
      pSVar3 = StrWriter::operator<<((StrWriter *)addr_local,suffix);
      StrWriter::operator<<(pSVar3,pcStack_48);
      puVar1 = addr_local;
      if ((prefix._2_1_ == 3) && (1 < prefix._1_1_)) {
        Int::Int(local_88,(uint)(byte)prefix);
        StrWriter::operator<<((StrWriter *)puVar1,local_88[0]);
      }
    }
    else {
      pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
      pSVar3 = StrWriter::operator<<(pSVar3,r);
      local_90 = addr_local[0xe];
      StrWriter::operator<<(pSVar3,(Tab)local_90);
      puVar1 = addr_local;
      if ((prefix._2_1_ == 3) && (1 < prefix._1_1_)) {
        Int::Int(&local_94,(uint)(byte)prefix);
        StrWriter::operator<<((StrWriter *)puVar1,local_94);
      }
      pSVar3 = StrWriter::operator<<((StrWriter *)addr_local,suffix);
      StrWriter::operator<<(pSVar3,pcStack_48);
      if (local_4c == 2) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
        Op<(moira::Mode)10,2>(&local_ac,this,(ushort)prefix._3_1_,_old);
        StrWriter::operator<<(pSVar3,&local_ac);
      }
      if (local_4c == 4) {
        pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
        Op<(moira::Mode)10,4>(&local_c4,this,(ushort)prefix._3_1_,_old);
        StrWriter::operator<<(pSVar3,&local_c4);
      }
    }
  }
  else {
    *_old = _nr;
    dasmIllegal<(moira::Instr)184,(moira::Mode)10,0>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmPMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto fmt  = xxx_____________ (ext);
    auto preg = ___xxx__________ (ext);
    auto nr   = ___________xxx__ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    const char *prefix = str.style.syntax == Syntax::GNU_MIT || str.style.syntax == Syntax::MOIRA_MIT ? "%" : "";
    const char *suffix = (ext & 0x100) ? "fd" : "";
    const char *r = "";
    Size s = Size(Unsized);

    switch (fmt) {

        case 0:

            switch (preg) {

                case 0b010: r = "tt0";  s = Long; break;
                case 0b011: r = "tt1";  s = Long; break;
            }
            break;

        case 2:

            switch (preg) {

                case 0b000: r = "tc";   s = Long; break;
                case 0b001: r = "drp";  s = Long; break;
                case 0b010: r = "srp";  s = Long; break;
                case 0b011: r = "crp";  s = Long; break;
                case 0b100: r = "cal";  s = Long; break;
                case 0b101: r = "val";  s = Long; break;
                case 0b110: r = "scc";  s = Long; break;
                case 0b111: r = "ac";   s = Long; break;
            }
            break;

        case 3:

            switch (preg) {

                case 0b000: r = "psr";  s = Word; break;
                case 0b001: r = "pcsr"; s = Word; break;
                case 0b100: r = "bad";  s = Word; break;
                case 0b101: r = "bac";  s = Word; break;
            }
            break;
    }

    if (!(ext & 0x200)) {

        str << Ins<I>{} << suffix << str.tab;
        if (s == Word) str << Op<M, Word>(reg, addr) << Sep{};
        if (s == Long) str << Op<M, Long>(reg, addr) << Sep{};
        str << prefix << r;
        if (fmt == 3 && preg > 1) str << Int(nr);

    } else {

        str << Ins<I>{} << suffix << str.tab;
        if (fmt == 3 && preg > 1) str << Int(nr);
        str << prefix << r;
        if (s == Word) str << Sep{} << Op<M, Word>(reg, addr);
        if (s == Long) str << Sep{} << Op<M, Long>(reg, addr);
    }
}